

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.hpp
# Opt level: O1

void __thiscall Object::Object(Object *this,Json *conf,BSDF *bsdf)

{
  bool bVar1;
  Primitive *pPVar2;
  const_reference pvVar3;
  Transformed *this_00;
  Light *pLVar4;
  undefined1 uVar5;
  float fVar6;
  vec3f vVar7;
  const_iterator result;
  mat4f m;
  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_90;
  mat4f local_70;
  
  this->bsdf = (BSDF *)0x0;
  this->emission = (Light *)0x0;
  this->primitive = (Primitive *)0x0;
  this->bsdf = bsdf;
  pPVar2 = newPrimitive(conf);
  this->primitive = pPVar2;
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
  ::find<char_const(&)[10]>
            ((const_iterator *)&local_70,
             (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
              *)conf,(char (*) [10])"transform");
  local_90.m_it.primitive_iterator.m_it = -0x8000000000000000;
  local_90.m_it.array_iterator._M_current = (pointer)0x0;
  local_90.m_it.object_iterator._M_node = (_Base_ptr)0x0;
  if (conf->m_type == array) {
    local_90.m_it.array_iterator._M_current =
         (((conf->m_value).array)->
         super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
  }
  else if (conf->m_type == object) {
    local_90.m_it.object_iterator._M_node =
         &(((conf->m_value).object)->_M_t)._M_impl.super__Rb_tree_header._M_header;
  }
  else {
    local_90.m_it.primitive_iterator.m_it = 1;
  }
  local_90.m_object = conf;
  bVar1 = nlohmann::detail::
          iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::operator==((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                        *)&local_70,&local_90);
  if (!bVar1) {
    pvVar3 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)conf,"transform");
    parseTransform(&local_70,pvVar3);
    if ((((((((local_70.data[0][0] != 1.0) || (NAN(local_70.data[0][0]))) ||
            (local_70.data[0][1] != 0.0)) ||
           (((NAN(local_70.data[0][1]) || (local_70.data[0][2] != 0.0)) ||
            ((NAN(local_70.data[0][2]) ||
             ((local_70.data[0][3] != 0.0 || (NAN(local_70.data[0][3]))))))))) ||
          (local_70.data[1][0] != 0.0)) ||
         ((((((NAN(local_70.data[1][0]) || (local_70.data[1][1] != 1.0)) ||
             (NAN(local_70.data[1][1]))) ||
            ((local_70.data[1][2] != 0.0 || (NAN(local_70.data[1][2]))))) ||
           (local_70.data[1][3] != 0.0)) ||
          (((NAN(local_70.data[1][3]) || (local_70.data[2][0] != 0.0)) ||
           (((NAN(local_70.data[2][0]) ||
             (((local_70.data[2][1] != 0.0 || (NAN(local_70.data[2][1]))) ||
              (local_70.data[2][2] != 1.0)))) ||
            (((NAN(local_70.data[2][2]) || (local_70.data[2][3] != 0.0)) ||
             (NAN(local_70.data[2][3]))))))))))) ||
        (((local_70.data[3][0] != 0.0 || (NAN(local_70.data[3][0]))) ||
         ((local_70.data[3][1] != 0.0 ||
          (((NAN(local_70.data[3][1]) || (local_70.data[3][2] != 0.0)) || (NAN(local_70.data[3][2]))
           ))))))) || ((local_70.data[3][3] != 1.0 || (NAN(local_70.data[3][3]))))) {
      pPVar2 = this->primitive;
      this_00 = (Transformed *)operator_new(0xa8);
      Transformed::Transformed(this_00,pPVar2,&local_70);
      this->primitive = (Primitive *)this_00;
    }
  }
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
  ::find<char_const(&)[9]>
            ((const_iterator *)&local_70,
             (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
              *)conf,(char (*) [9])"emission");
  local_90.m_it.primitive_iterator.m_it = -0x8000000000000000;
  local_90.m_it.array_iterator._M_current = (pointer)0x0;
  local_90.m_it.object_iterator._M_node = (_Base_ptr)0x0;
  if (conf->m_type == array) {
    local_90.m_it.array_iterator._M_current =
         (((conf->m_value).array)->
         super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
  }
  else if (conf->m_type == object) {
    local_90.m_it.object_iterator._M_node =
         &(((conf->m_value).object)->_M_t)._M_impl.super__Rb_tree_header._M_header;
  }
  else {
    local_90.m_it.primitive_iterator.m_it = 1;
  }
  local_90.m_object = conf;
  bVar1 = nlohmann::detail::
          iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::operator==((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                        *)&local_70,&local_90);
  if (!bVar1) {
    nlohmann::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
    ::find<char_const(&)[7]>
              ((const_iterator *)&local_70,
               (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                *)conf,(char (*) [7])"sample");
    local_90.m_it.primitive_iterator.m_it = -0x8000000000000000;
    local_90.m_it.array_iterator._M_current = (pointer)0x0;
    local_90.m_it.object_iterator._M_node = (_Base_ptr)0x0;
    if (conf->m_type == array) {
      local_90.m_it.array_iterator._M_current =
           (((conf->m_value).array)->
           super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
    }
    else if (conf->m_type == object) {
      local_90.m_it.object_iterator._M_node =
           &(((conf->m_value).object)->_M_t)._M_impl.super__Rb_tree_header._M_header;
    }
    else {
      local_90.m_it.primitive_iterator.m_it = 1;
    }
    local_90.m_object = conf;
    bVar1 = nlohmann::detail::
            iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
            ::operator==((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                          *)&local_70,&local_90);
    uVar5 = true;
    if (!bVar1) {
      pvVar3 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)conf,"sample");
      nlohmann::detail::
      from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                (pvVar3,(boolean_t *)&local_70);
      uVar5 = local_70.data[0][0]._0_1_;
    }
    nlohmann::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
    ::find<char_const(&)[13]>
              ((const_iterator *)&local_70,
               (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                *)conf,(char (*) [13])"sampled_side");
    local_90.m_it.primitive_iterator.m_it = -0x8000000000000000;
    local_90.m_it.array_iterator._M_current = (pointer)0x0;
    local_90.m_it.object_iterator._M_node = (_Base_ptr)0x0;
    if (conf->m_type == array) {
      local_90.m_it.array_iterator._M_current =
           (((conf->m_value).array)->
           super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
    }
    else if (conf->m_type == object) {
      local_90.m_it.object_iterator._M_node =
           &(((conf->m_value).object)->_M_t)._M_impl.super__Rb_tree_header._M_header;
    }
    else {
      local_90.m_it.primitive_iterator.m_it = 1;
    }
    local_90.m_object = conf;
    bVar1 = nlohmann::detail::
            iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
            ::operator==((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                          *)&local_70,&local_90);
    fVar6 = 0.0;
    if (!bVar1) {
      pvVar3 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)conf,"sampled_side");
      nlohmann::detail::
      from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_int,_0>
                (pvVar3,(int *)&local_70);
      fVar6 = local_70.data[0][0];
    }
    pLVar4 = (Light *)operator_new(0x28);
    pvVar3 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)conf,"emission");
    vVar7 = json2vec3f(pvVar3);
    pPVar2 = this->primitive;
    pLVar4->samplable = (bool)uVar5;
    pLVar4->_vptr_Light = (_func_int **)&PTR_sampleIrradiance_0016b7d0;
    *(long *)&pLVar4->field_0xc = vVar7._0_8_;
    *(float *)((long)&pLVar4[1]._vptr_Light + 4) = vVar7.z;
    *(Primitive **)&pLVar4[1].samplable = pPVar2;
    *(float *)&pLVar4[2]._vptr_Light = fVar6;
    this->emission = pLVar4;
  }
  return;
}

Assistant:

Object(const Json& conf, BSDF* bsdf)
	{
		this->bsdf = bsdf;
		primitive = newPrimitive(conf);
		// apply transform
		if (conf.find("transform") != conf.end())
		{
			mat4f m = parseTransform(conf["transform"]);
			if (m != mat4f::unit) {
				Primitive* t = primitive;
				primitive = new Transformed(t, m);
			}
		}
		// apply emission
		if (conf.find("emission") != conf.end()) {
			bool samplable = true;
			if (conf.find("sample") != conf.end()) {
				samplable = conf["sample"];
			}
			int sampled_side = 0;
			if (conf.find("sampled_side") != conf.end()) {
				sampled_side = conf["sampled_side"];
			}
			this->emission = new DiffuseLight(samplable, json2vec3f(conf["emission"]), primitive, sampled_side);
		}
	}